

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O2

void http_sconn_rxdone(void *arg)

{
  nni_aio *aio;
  char cVar1;
  long lVar2;
  ulong size;
  nng_err nVar3;
  nng_http_status nVar4;
  int iVar5;
  nng_sockaddr_in *req;
  nni_http_res *res;
  char *pcVar6;
  ulonglong uVar7;
  void *pvVar8;
  char *__n;
  undefined8 uVar9;
  undefined4 extraout_var_00;
  void *pvVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  undefined1 auStack_f8 [8];
  char *end;
  undefined1 uStack_e8;
  undefined1 uStack_e7;
  undefined1 uStack_e6;
  undefined1 uStack_e5;
  nni_list *local_70;
  char *local_68;
  ulong local_60;
  char *local_58;
  nni_mtx *local_50;
  char *local_48;
  void *local_40;
  char *local_38;
  undefined4 extraout_var;
  
  lVar2 = *(long *)((long)arg + 0x18);
  aio = (nni_aio *)((long)arg + 0x210);
  req = (nng_sockaddr_in *)nni_http_conn_req(*(nng_http **)((long)arg + 0x10));
  nVar3 = nni_aio_result(aio);
  if (nVar3 != NNG_OK) {
    http_sconn_close((http_sconn *)arg);
    return;
  }
  if (*(long *)((long)arg + 0x38) != 0) {
    *(undefined8 *)((long)arg + 0x38) = 0;
    nni_http_read_req(*(nni_http_conn **)((long)arg + 0x10),aio);
    return;
  }
  pvVar11 = *(void **)((long)arg + 0x20);
  if (pvVar11 != (void *)0x0) {
    nni_mtx_lock((nni_mtx *)(lVar2 + 0xd0));
LAB_001364c1:
    *(void **)((long)arg + 0x28) = pvVar11;
    *(undefined8 *)((long)arg + 0x20) = 0;
    nni_atomic_inc((nni_atomic_int *)((long)pvVar11 + 0x5bc));
    nni_aio_reset((nni_aio *)((long)arg + 0x48));
    nni_mtx_unlock((nni_mtx *)(lVar2 + 0xd0));
    res = nni_http_conn_res(*(nng_http **)((long)arg + 0x10));
    nni_http_res_reset(res);
    nni_http_set_version(*(nng_http **)((long)arg + 0x10),"HTTP/1.1");
    nni_http_set_status(*(nng_http **)((long)arg + 0x10),0,(char *)0x0);
    (**(code **)((long)pvVar11 + 0x5e8))
              (*(undefined8 *)((long)arg + 0x10),*(undefined8 *)((long)pvVar11 + 0x5d8),
               (nni_aio *)((long)arg + 0x48));
    return;
  }
  nVar4 = nng_http_get_status(*(nng_http **)((long)arg + 0x10));
  if (399 < nVar4) {
    nVar4 = nng_http_get_status(*(nng_http **)((long)arg + 0x10));
    goto LAB_0013688d;
  }
  pcVar6 = nng_http_get_version(*(nng_http **)((long)arg + 0x10));
  if (pcVar6 == (char *)0x0) {
LAB_00136881:
    *(undefined1 *)((long)arg + 0x30) = 1;
  }
  else {
    iVar5 = strncmp(pcVar6,"HTTP/1.",7);
    if (iVar5 != 0) {
      *(undefined1 *)((long)arg + 0x30) = 1;
      nVar4 = NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP;
      goto LAB_0013688d;
    }
    iVar5 = strcmp(pcVar6,"HTTP/1.1");
    if (iVar5 != 0) {
      *(undefined1 *)((long)arg + 0x30) = 1;
    }
    pcVar6 = nng_http_get_uri(*(nng_http **)((long)arg + 0x10));
    if (*pcVar6 != '/') goto LAB_00136881;
    local_68 = pcVar6;
    pcVar6 = nni_http_get_header(*(nng_http **)((long)arg + 0x10),"Connection");
    if ((pcVar6 != (char *)0x0) && (pcVar6 = nni_strcasestr(pcVar6,"close"), pcVar6 != (char *)0x0))
    {
      *(undefined1 *)((long)arg + 0x30) = 1;
    }
    *(undefined8 *)((long)arg + 0x38) = 0;
    pcVar6 = nni_http_get_header(*(nng_http **)((long)arg + 0x10),"Content-Length");
    if (pcVar6 != (char *)0x0) {
      uVar7 = strtoull(pcVar6,(char **)auStack_f8,10);
      *(ulonglong *)((long)arg + 0x38) = uVar7;
    }
    local_48 = nni_http_get_header(*(nng_http **)((long)arg + 0x10),"Host");
    if (local_48 != (char *)0x0 || iVar5 != 0) {
      local_50 = (nni_mtx *)(lVar2 + 0xd0);
      nni_mtx_lock(local_50);
      local_70 = (nni_list *)(lVar2 + 0xa0);
      pvVar8 = nni_list_first(local_70);
      local_60 = 0;
      pvVar11 = (void *)0x0;
      while (pvVar8 != (void *)0x0) {
        local_38 = (char *)((long)pvVar8 + 0x430);
        local_40 = pvVar8;
        pcVar6 = (char *)strlen(local_38);
        pvVar10 = pvVar11;
        if (pcVar6 == (char *)0x0) goto LAB_0013679a;
        if (local_48 != (char *)0x0) {
          local_58 = pcVar6;
          if (*(char *)((long)local_40 + 0x5b8) == '\x01') {
            iVar5 = nni_parse_ip_port(local_48,(nni_sockaddr *)auStack_f8);
            if (iVar5 == 0) {
              if (*(short *)((long)local_40 + 0x530) == 4) {
                if (auStack_f8._0_2_ == 4) {
                  auVar12[0] = -(auStack_f8[4] == *(char *)((long)local_40 + 0x534));
                  auVar12[1] = -(auStack_f8[5] == *(char *)((long)local_40 + 0x535));
                  auVar12[2] = -(auStack_f8[6] == *(char *)((long)local_40 + 0x536));
                  auVar12[3] = -(auStack_f8[7] == *(char *)((long)local_40 + 0x537));
                  auVar12[4] = -((char)end == *(char *)((long)local_40 + 0x538));
                  auVar12[5] = -(end._1_1_ == *(char *)((long)local_40 + 0x539));
                  auVar12[6] = -(end._2_1_ == *(char *)((long)local_40 + 0x53a));
                  auVar12[7] = -(end._3_1_ == *(char *)((long)local_40 + 0x53b));
                  auVar12[8] = -(end._4_1_ == *(char *)((long)local_40 + 0x53c));
                  auVar12[9] = -(end._5_1_ == *(char *)((long)local_40 + 0x53d));
                  auVar12[10] = -(end._6_1_ == *(char *)((long)local_40 + 0x53e));
                  auVar12[0xb] = -(end._7_1_ == *(char *)((long)local_40 + 0x53f));
                  auVar12[0xc] = -(uStack_e8 == *(char *)((long)local_40 + 0x540));
                  auVar12[0xd] = -(uStack_e7 == *(char *)((long)local_40 + 0x541));
                  auVar12[0xe] = -(uStack_e6 == *(char *)((long)local_40 + 0x542));
                  auVar12[0xf] = -(uStack_e5 == *(char *)((long)local_40 + 0x543));
                  if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar12[0xf] >> 7) << 0xf) == 0xffff) goto LAB_0013679a;
                }
              }
              else {
                if (*(short *)((long)local_40 + 0x530) != 3) goto LAB_0013671a;
                if ((auStack_f8._0_2_ == 3) &&
                   (auStack_f8._4_4_ == *(uint32_t *)((long)local_40 + 0x534))) goto LAB_0013679a;
              }
            }
          }
          else {
LAB_0013671a:
            iVar5 = nni_strncasecmp(local_48,local_38,(size_t)local_58);
            if ((iVar5 == 0) &&
               (((cVar1 = local_48[(long)local_58], cVar1 == '\0' || (cVar1 == ':')) ||
                ((cVar1 == '.' && ((local_48 + 1)[(long)local_58] == '\0')))))) {
LAB_0013679a:
              local_38 = (char *)((long)local_40 + 0x10);
              __n = (char *)strlen(local_38);
              pcVar6 = local_38;
              local_38 = __n;
              iVar5 = strncmp(local_68,pcVar6,(size_t)__n);
              if ((iVar5 == 0) &&
                 ((local_68[(long)local_38] == '\0' ||
                  ((local_68[(long)local_38] == '/' &&
                   (((local_68 + 1)[(long)local_38] == '\0' ||
                    (*(char *)((long)local_40 + 0x5b9) == '\x01')))))))) {
                pvVar8 = local_40;
                if (*(char *)((long)local_40 + 0x410) == '\0') break;
                local_38 = (char *)((long)local_40 + 0x410);
                local_58 = nni_http_get_method(*(nng_http **)((long)arg + 0x10));
                iVar5 = strcmp(local_58,local_38);
                pvVar8 = local_40;
                if (iVar5 == 0) break;
                iVar5 = strcmp(local_58,"HEAD");
                uVar9 = CONCAT44(extraout_var,iVar5);
                if (iVar5 == 0) {
                  iVar5 = strcmp(local_38,"GET");
                  uVar9 = CONCAT44(extraout_var_00,iVar5);
                  pvVar10 = local_40;
                  if (iVar5 == 0) goto LAB_0013686d;
                }
                local_60 = CONCAT71((int7)((ulong)uVar9 >> 8),1);
                pvVar10 = pvVar11;
              }
            }
          }
        }
LAB_0013686d:
        pvVar8 = nni_list_next(local_70,local_40);
        pvVar11 = pvVar10;
      }
      if (pvVar11 == (void *)0x0) {
        pvVar11 = pvVar8;
      }
      if (pvVar8 != (void *)0x0) {
        pvVar11 = pvVar8;
      }
      if (pvVar11 == (void *)0x0) {
        nni_mtx_unlock(local_50);
        if ((local_60 & 1) == 0) {
          nVar4 = NNG_HTTP_STATUS_NOT_FOUND;
        }
        else {
          nVar4 = NNG_HTTP_STATUS_METHOD_NOT_ALLOWED;
        }
      }
      else {
        if ((*(char *)((long)pvVar11 + 0x5d0) != '\x01') ||
           (size = *(ulong *)((long)arg + 0x38), size == 0)) goto LAB_001364c1;
        if (*(ulong *)((long)pvVar11 + 0x5c8) < size) {
          nni_mtx_unlock(local_50);
          nVar4 = NNG_HTTP_STATUS_CONTENT_TOO_LARGE;
        }
        else {
          nVar3 = nni_http_req_alloc_data((nni_http_req *)req,size);
          if (nVar3 == NNG_OK) {
            auStack_f8 = *(undefined1 (*) [8])req;
            end = *(char **)(req + 1);
            *(undefined8 *)((long)arg + 0x38) = 0;
            *(void **)((long)arg + 0x20) = pvVar11;
            nni_mtx_unlock(local_50);
            nni_aio_set_iov(aio,1,(nni_iov *)auStack_f8);
            nni_http_read_full(*(nni_http_conn **)((long)arg + 0x10),aio);
            return;
          }
          nni_mtx_unlock(local_50);
          nVar4 = NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR;
        }
      }
      http_sconn_error((http_sconn *)arg,nVar4);
      return;
    }
  }
  nVar4 = NNG_HTTP_STATUS_BAD_REQUEST;
LAB_0013688d:
  http_sconn_error((http_sconn *)arg,nVar4);
  return;
}

Assistant:

static void
http_sconn_rxdone(void *arg)
{
	http_sconn       *sc  = arg;
	nni_http_server  *s   = sc->server;
	nni_aio          *aio = &sc->rxaio;
	int               rv;
	nni_http_handler *h    = NULL;
	nni_http_handler *head = NULL;
	const char       *val;
	nni_http_req     *req = nni_http_conn_req(sc->conn);
	const char       *uri;
	bool              badmeth  = false;
	bool              needhost = false;
	const char       *host;
	const char       *cls;

	if ((rv = nni_aio_result(aio)) != NNG_OK) {
		http_sconn_close(sc);
		return;
	}

	// read the body, keep going
	if (sc->unconsumed_body) {
		sc->unconsumed_body = 0;
		nni_http_read_req(sc->conn, aio);
		return;
	}

	if ((h = sc->handler) != NULL) {
		nni_mtx_lock(&s->mtx);
		goto finish;
	}

	// Validate the request -- it has to at least look like HTTP
	// 1.x.  We flatly refuse to deal with HTTP 0.9, and we can't
	// cope with HTTP/2.
	if (nng_http_get_status(sc->conn) >= NNG_HTTP_STATUS_BAD_REQUEST) {
		http_sconn_error(sc, nng_http_get_status(sc->conn));
		return;
	}
	if ((val = nng_http_get_version(sc->conn)) == NULL) {
		sc->close = true;
		http_sconn_error(sc, NNG_HTTP_STATUS_BAD_REQUEST);
		return;
	}
	if (strncmp(val, "HTTP/1.", 7) != 0) {
		sc->close = true;
		http_sconn_error(sc, NNG_HTTP_STATUS_HTTP_VERSION_NOT_SUPP);
		return;
	}
	if (strcmp(val, "HTTP/1.1") != 0) {
		// We treat HTTP/1.0 connections as non-persistent.
		// No effort is made for non-standard "persistent" HTTP/1.0.
		sc->close = true;
	} else {
		needhost = true;
	}

	// NB: The URI will already have been canonified by the REQ parser
	uri = nng_http_get_uri(sc->conn);
	if (uri[0] != '/') {
		// We do not support authority form or asterisk form at present
		sc->close = true;
		http_sconn_error(sc, NNG_HTTP_STATUS_BAD_REQUEST);
		return;
	}

	// If the connection was 1.0, or a connection: close was
	// requested, then mark this close on our end.
	if ((val = nni_http_get_header(sc->conn, "Connection")) != NULL) {
		// HTTP 1.1 says these have to be case insensitive
		if (nni_strcasestr(val, "close") != NULL) {
			// In theory this could falsely match some other weird
			// connection header with the substring close.  No such
			// values are defined, so anyone who does that gets
			// what they deserve. (Harmless actually, since it only
			// prevents persistent connections.)
			sc->close = true;
		}
	}

	sc->unconsumed_body = 0;
	if ((cls = nni_http_get_header(sc->conn, "Content-Length")) != NULL) {
		char *end;
		sc->unconsumed_body = strtoull(cls, &end, 10);
		if ((end == NULL) && (*end != '\0')) {
			sc->unconsumed_body = 0;
			http_sconn_error(sc, NNG_HTTP_STATUS_BAD_REQUEST);
			return;
		}
	}

	host = nni_http_get_header(sc->conn, "Host");
	if ((host == NULL) && (needhost)) {
		// Per RFC 2616 14.23 we have to send 400 status here.
		http_sconn_error(sc, NNG_HTTP_STATUS_BAD_REQUEST);
		return;
	}

	nni_mtx_lock(&s->mtx);
	NNI_LIST_FOREACH (&s->handlers, h) {
		size_t len;

		if (!http_handler_host_match(h, host)) {
			continue;
		}

		len = strlen(h->uri);
		if (strncmp(uri, h->uri, len) != 0) {
			continue;
		}
		switch (uri[len]) {
		case '\0':
			break;
		case '/':
			if ((uri[len + 1] != '\0') && (!h->tree)) {
				// Trailing component and not a directory.
				continue;
			}
			break;
		default:
			continue; // Some other substring, not matched.
		}

		if (h->method[0] == '\0') {
			// Handler wants to process *all* methods.
			break;
		}
		// So, what about the method?
		val = nni_http_get_method(sc->conn);
		if (strcmp(val, h->method) == 0) {
			break;
		}
		// HEAD is remapped to GET, but only if no HEAD specific
		// handler registered.
		if ((strcmp(val, "HEAD") == 0) &&
		    (strcmp(h->method, "GET") == 0)) {
			head = h;
			continue;
		}
		badmeth = 1;
	}

	if ((h == NULL) && (head != NULL)) {
		h = head;
	}
	if (h == NULL) {
		nni_mtx_unlock(&s->mtx);
		if (badmeth) {
			http_sconn_error(
			    sc, NNG_HTTP_STATUS_METHOD_NOT_ALLOWED);
		} else {
			http_sconn_error(sc, NNG_HTTP_STATUS_NOT_FOUND);
		}
		return;
	}

	if ((h->getbody) && (sc->unconsumed_body > 0)) {

		if (sc->unconsumed_body > h->maxbody) {
			nni_mtx_unlock(&s->mtx);
			http_sconn_error(
			    sc, NNG_HTTP_STATUS_CONTENT_TOO_LARGE);
			return;
		}
		nng_iov iov;
		if ((nni_http_req_alloc_data(req, sc->unconsumed_body)) != 0) {
			nni_mtx_unlock(&s->mtx);
			http_sconn_error(
			    sc, NNG_HTTP_STATUS_INTERNAL_SERVER_ERROR);
			return;
		}
		iov.iov_buf         = req->data.data;
		iov.iov_len         = req->data.size;
		sc->unconsumed_body = 0;
		sc->handler         = h;
		nni_mtx_unlock(&s->mtx);
		nni_aio_set_iov(&sc->rxaio, 1, &iov);
		nni_http_read_full(sc->conn, aio);
		return;
	}

finish:
	sc->release = h;
	sc->handler = NULL;

	// Set a reference -- this because the callback may be running
	// asynchronously even after it gets removed from the server.
	nni_atomic_inc(&h->ref);

	nni_aio_reset(&sc->cbaio);

	nni_mtx_unlock(&s->mtx);

	// make sure the response is freshly initialized
	nni_http_res_reset(nni_http_conn_res(sc->conn));
	nni_http_set_version(sc->conn, NNG_HTTP_VERSION_1_1);
	nni_http_set_status(sc->conn, 0, NULL);

	h->cb(sc->conn, h->data, &sc->cbaio);
}